

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int add_conterexample(saucy *s,sim_result *cex)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  int extraout_EAX;
  long lVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  
  lVar4 = (long)s->pNtk->vPis->nSize;
  cex->inVecSignature = 0;
  if (0 < lVar4) {
    lVar6 = 0;
    do {
      if (cex->inVec[lVar6] != 0) {
        cex->inVecSignature =
             (int)lVar6 * (int)lVar6 * cex->inVec[lVar6] + cex->inVecSignature ^ 0xabcd;
      }
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
  }
  pVVar3 = s->satCounterExamples;
  uVar1 = pVVar3->nSize;
  if (0 < (long)(int)uVar1) {
    lVar4 = 0;
    do {
      if (*(int *)((long)pVVar3->pArray[lVar4] + 0x10) == cex->inVecSignature) {
        return uVar1;
      }
      lVar4 = lVar4 + 1;
    } while ((int)uVar1 != lVar4);
  }
  uVar2 = pVVar3->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar2 * 2;
      if (iVar7 <= (int)uVar2) goto LAB_0030d125;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
      }
      pVVar3->pArray = ppvVar5;
    }
    pVVar3->nCap = iVar7;
  }
LAB_0030d125:
  iVar7 = pVVar3->nSize;
  pVVar3->nSize = iVar7 + 1;
  pVVar3->pArray[iVar7] = cex;
  bumpActivity(s,cex);
  return extraout_EAX;
}

Assistant:

static int
add_conterexample(struct saucy *s, struct sim_result * cex)
{
    int i;
    int nins = Abc_NtkPiNum(s->pNtk);
    struct sim_result * savedcex;
    
    cex->inVecSignature = 0;
    for (i = 0; i < nins; i++) {
        if (cex->inVec[i]) {
            cex->inVecSignature += (cex->inVec[i] * i * i);
            cex->inVecSignature ^= 0xABCD;
        }
    }

    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
        savedcex = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
        if (savedcex->inVecSignature == cex->inVecSignature) {
            //bumpActivity(s, savedcex);
            return 0;
        }
    }
    
    Vec_PtrPush(s->satCounterExamples, cex);
    bumpActivity(s, cex);
    return 1;
}